

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O2

Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* Program::create(Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *__return_storage_ptr__,string *fragment_src,string *vertex_src)

{
  uint uVar1;
  string *psVar2;
  string *this;
  string *this_00;
  Handle handle;
  GLint linked;
  Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  vertex_result;
  Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  fragment_result;
  GLsizei length;
  char info [2048];
  Handle local_8c8;
  int local_8c4;
  undefined1 local_8c0 [32];
  bool local_8a0;
  undefined1 local_898 [32];
  bool local_878;
  undefined1 local_870 [16];
  string local_860 [20];
  undefined4 local_84c;
  undefined1 local_848 [32];
  _Alloc_hider local_828;
  size_type local_820;
  string local_818 [8];
  undefined8 uStack_810;
  
  uVar1 = glCreateProgram();
  local_8c8.name_ = uVar1;
  if (uVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_8c0,"Cannot create program",(allocator<char> *)local_898);
  }
  else {
    if ((vertex_src->_M_string_length != 0) && (fragment_src->_M_string_length != 0)) {
      anon_unknown.dwarf_721ea::Shader::create
                ((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_8c0,0x8b31,vertex_src);
      if (local_8a0 == false) {
        Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_8c0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_898,"Cannot compile vertex shader: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_8c0);
        local_828._M_p = (pointer)local_818;
        if ((undefined1 *)local_898._0_8_ == local_898 + 0x10) {
          uStack_810 = local_898._24_8_;
        }
        else {
          local_828._M_p = (pointer)local_898._0_8_;
        }
        local_820 = local_898._8_8_;
        local_898._8_8_ = 0;
        local_898[0x10] = '\0';
        local_898._0_8_ = local_898 + 0x10;
        Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,(UnexpectedType *)&local_828);
        std::__cxx11::string::~string((string *)&local_828);
        std::__cxx11::string::~string((string *)local_898);
      }
      else {
        anon_unknown.dwarf_721ea::Shader::create
                  ((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_898,0x8b30,fragment_src);
        if (local_878 == false) {
          Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::error((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_898);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_870,"Cannot compile fragment shader: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_898);
          local_828._M_p = (pointer)local_818;
          psVar2 = local_860;
          if ((string *)local_870._0_8_ == psVar2) {
            uStack_810._0_1_ = local_860[8];
            uStack_810._1_1_ = local_860[9];
            uStack_810._2_1_ = local_860[10];
            uStack_810._3_1_ = local_860[0xb];
            uStack_810._4_1_ = local_860[0xc];
            uStack_810._5_1_ = local_860[0xd];
            uStack_810._6_1_ = local_860[0xe];
            uStack_810._7_1_ = local_860[0xf];
          }
          else {
            local_828._M_p = (pointer)local_870._0_8_;
          }
          this = (string *)local_870;
          this_00 = (string *)&local_828;
          local_848._8_8_ = local_870._8_8_;
LAB_0011e213:
          *(undefined8 *)(this_00 + 8) = local_848._8_8_;
          *(string **)&this->field_0x0 = psVar2;
          *(undefined8 *)(this + 8) = 0;
          this[0x10] = (string)0x0;
          Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Expected(__return_storage_ptr__,(UnexpectedType *)this_00);
          std::__cxx11::string::~string(this_00);
          std::__cxx11::string::~string(this);
        }
        else {
          Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator->((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_8c0);
          glAttachShader(uVar1,local_8c0._0_8_ & 0xffffffff);
          Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator->((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_898);
          glAttachShader(uVar1,local_898._0_8_ & 0xffffffff);
          glLinkProgram(uVar1);
          local_8c4 = 0;
          glGetProgramiv(uVar1,0x8b82);
          if (local_8c4 != 1) {
            local_84c = 0;
            glGetProgramInfoLog(uVar1,0x800,&local_84c,&local_828);
            format_abi_cxx11_((string *)local_848,"Program link error: %s",&local_828);
            local_870._0_8_ = local_860;
            psVar2 = (string *)(local_848 + 0x10);
            if ((string *)local_848._0_8_ == psVar2) {
              local_860[8] = (string)local_848[0x18];
              local_860[9] = (string)local_848[0x19];
              local_860[10] = (string)local_848[0x1a];
              local_860[0xb] = (string)local_848[0x1b];
              local_860[0xc] = (string)local_848[0x1c];
              local_860[0xd] = (string)local_848[0x1d];
              local_860[0xe] = (string)local_848[0x1e];
              local_860[0xf] = (string)local_848[0x1f];
            }
            else {
              local_870._0_8_ = local_848._0_8_;
            }
            this = (string *)local_848;
            this_00 = (string *)local_870;
            goto LAB_0011e213;
          }
          aAppDebugPrintf("Built program %u",(ulong)uVar1);
          local_8c8.name_ = 0;
          *(uint *)&__return_storage_ptr__->field_0 = uVar1;
          local_828._M_p = local_828._M_p & 0xffffffff00000000;
          __return_storage_ptr__->has_value_ = true;
          Handle::~Handle((Handle *)&local_828);
        }
        Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Expected((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_898);
      }
      Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected((Expected<(anonymous_namespace)::Shader,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_8c0);
      goto LAB_0011e253;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_8c0,"Empty shader sources",(allocator<char> *)local_898);
  }
  local_828._M_p = (pointer)local_818;
  if ((undefined1 *)local_8c0._0_8_ == local_8c0 + 0x10) {
    uStack_810 = local_8c0._24_8_;
  }
  else {
    local_828._M_p = (pointer)local_8c0._0_8_;
  }
  local_820 = local_8c0._8_8_;
  local_8c0._8_8_ = 0;
  local_8c0[0x10] = '\0';
  local_8c0._0_8_ = local_8c0 + 0x10;
  Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Expected(__return_storage_ptr__,(UnexpectedType *)&local_828);
  std::__cxx11::string::~string((string *)&local_828);
  std::__cxx11::string::~string((string *)local_8c0);
LAB_0011e253:
  Handle::~Handle(&local_8c8);
  return __return_storage_ptr__;
}

Assistant:

Expected<Program,std::string> Program::create(const std::string& fragment_src, const std::string &vertex_src) {
	Handle handle(glCreateProgram());
	if (!handle.name())
		return Unexpected(std::string("Cannot create program"));

	if (vertex_src.empty() || fragment_src.empty())
		return Unexpected(std::string("Empty shader sources"));

	auto vertex_result = Shader::create(GL_VERTEX_SHADER, vertex_src);
	if (!vertex_result.hasValue())
		return Unexpected("Cannot compile vertex shader: " + vertex_result.error());

	auto fragment_result = Shader::create(GL_FRAGMENT_SHADER, fragment_src);
	if (!fragment_result.hasValue())
		return Unexpected("Cannot compile fragment shader: " + fragment_result.error());

	glAttachShader(handle.name(), vertex_result->name());
	glAttachShader(handle.name(), fragment_result->name());

	glLinkProgram(handle.name());

	GLint linked = GL_FALSE;
	glGetProgramiv(handle.name(), GL_LINK_STATUS, &linked);
	if (linked != GL_TRUE) {
		GLsizei length = 0;
		char info[2048];
		glGetProgramInfoLog(handle.name(), COUNTOF(info), &length, info);
		return Unexpected(format("Program link error: %s", info));
	}

	MSG("Built program %u", handle.name());
	return Program(std::move(handle));
}